

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12cdf1::CBSTest_BitString_Test::TestBody(CBSTest_BitString_Test *this)

{
  long *plVar1;
  int iVar2;
  uint *message;
  long lVar3;
  char *message_00;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  initializer_list<unsigned_char> __l_16;
  initializer_list<unsigned_char> __l_17;
  initializer_list<unsigned_char> __l_18;
  initializer_list<unsigned_char> __l_19;
  initializer_list<unsigned_char> __l_20;
  initializer_list<unsigned_char> __l_21;
  initializer_list<unsigned_char> __l_22;
  initializer_list<unsigned_char> __l_23;
  ScopedTrace gtest_trace_1256;
  AssertHelper local_b0;
  ScopedTrace gtest_trace_1308;
  AssertionResult gtest_ar_;
  allocator_type local_8f;
  allocator_type local_8e;
  allocator_type local_8d;
  allocator_type local_8c;
  allocator_type local_8b;
  allocator_type local_8a;
  allocator_type local_89;
  undefined2 local_88;
  undefined1 local_86;
  allocator_type local_85;
  undefined2 local_84;
  undefined1 local_82;
  allocator_type local_81;
  allocator_type local_80;
  allocator_type local_7f;
  allocator_type local_7e;
  allocator_type local_7d;
  allocator_type local_7c;
  allocator_type local_7b;
  allocator_type local_7a;
  uchar local_79;
  CBS cbs;
  undefined2 local_66;
  undefined1 local_64;
  undefined2 local_63;
  undefined1 local_61;
  CBS cbs_2;
  uchar local_3e [14];
  
  if ((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                 kValidBitStrings);
    if (iVar2 != 0) {
      _gtest_trace_1308 = _gtest_trace_1308 & 0xff00;
      __l._M_len = 1;
      __l._M_array = (iterator)&gtest_trace_1308;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings,__l,(allocator_type *)&gtest_trace_1256);
      cbs.data = (uint8_t *)CONCAT62(cbs.data._2_6_,0x8007);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&cbs;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 1,__l_00,(allocator_type *)&local_84);
      gtest_ar_.success_ = true;
      gtest_ar_._1_1_ = 0xf0;
      __l_01._M_len = 2;
      __l_01._M_array = &gtest_ar_.success_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 2,__l_01,(allocator_type *)&local_88);
      local_b0.data_._0_1_ = 0;
      local_b0.data_._1_1_ = 0xff;
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)&local_b0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 3,__l_02,(allocator_type *)&local_63);
      cbs_2.data = (uint8_t *)CONCAT17(cbs_2.data._7_1_,0xc0ffffffffff06);
      __l_03._M_len = 7;
      __l_03._M_array = (iterator)&cbs_2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kValidBitStrings + 4,__l_03,(allocator_type *)&local_66);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                           kValidBitStrings);
    }
  }
  for (lVar3 = 8; lVar3 != 0x80; lVar3 = lVar3 + 0x18) {
    cbs_2.data = *(uint8_t **)(lVar3 + 0x6a5418);
    cbs_2.len = *(long *)((long)&TestBody::kValidBitStrings[0].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar3) -
                (long)cbs_2.data;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_1256,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4e8,(Bytes *)&cbs_2);
    cbs.data = *(uint8_t **)(lVar3 + 0x6a5418);
    cbs.len = *(long *)((long)&TestBody::kValidBitStrings[0].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3) - (long)cbs.data;
    iVar2 = CBS_is_valid_asn1_bitstring(&cbs);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbs_2,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBS_is_valid_asn1_bitstring(&cbs)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_trace_1308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4eb,(char *)cbs_2.data);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_trace_1308,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_1308);
      std::__cxx11::string::~string((string *)&cbs_2);
      plVar1 = (long *)CONCAT44(local_b0.data_._4_4_,
                                CONCAT13(local_b0.data_._3_1_,
                                         CONCAT12(local_b0.data_._2_1_,
                                                  CONCAT11(local_b0.data_._1_1_,local_b0.data_._0_1_
                                                          ))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1256);
  }
  if ((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kInvalidBitStrings == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                 kInvalidBitStrings);
    if (iVar2 != 0) {
      TestBody::kInvalidBitStrings[0].
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TestBody::kInvalidBitStrings[0].
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      TestBody::kInvalidBitStrings[0].
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.data_._0_1_ = 1;
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&local_b0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 1,__l_04,(allocator_type *)&gtest_trace_1308);
      cbs.data = (uint8_t *)CONCAT62(cbs.data._2_6_,0xff08);
      __l_05._M_len = 2;
      __l_05._M_array = (iterator)&cbs;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 2,__l_05,(allocator_type *)&gtest_trace_1256);
      gtest_ar_.success_ = true;
      gtest_ar_._1_1_ = 0xff;
      __l_06._M_len = 2;
      __l_06._M_array = &gtest_ar_.success_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 3,__l_06,(allocator_type *)&local_84);
      cbs_2.data = (uint8_t *)CONCAT53(cbs_2.data._3_5_,0xc1ff06);
      __l_07._M_len = 3;
      __l_07._M_array = (iterator)&cbs_2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (TestBody::kInvalidBitStrings + 4,__l_07,(allocator_type *)&local_88);
      __cxa_atexit(__cxx_global_array_dtor_401,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                           kInvalidBitStrings);
    }
  }
  for (lVar3 = 8; lVar3 != 0x80; lVar3 = lVar3 + 0x18) {
    cbs_2.data = *(uint8_t **)
                  (&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings +
                  lVar3);
    cbs_2.len = *(long *)((long)&TestBody::kInvalidBitStrings[0].
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar3) -
                (long)cbs_2.data;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_1256,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x4fa,(Bytes *)&cbs_2);
    cbs.data = *(uint8_t **)
                (&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kValidBitStrings +
                lVar3);
    cbs.len = *(long *)((long)&TestBody::kInvalidBitStrings[0].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3) - (long)cbs.data;
    iVar2 = CBS_is_valid_asn1_bitstring(&cbs);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbs_2,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBS_is_valid_asn1_bitstring(&cbs)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_trace_1308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x4fd,(char *)cbs_2.data);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_trace_1308,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_1308);
      std::__cxx11::string::~string((string *)&cbs_2);
      plVar1 = (long *)CONCAT44(local_b0.data_._4_4_,
                                CONCAT13(local_b0.data_._3_1_,
                                         CONCAT12(local_b0.data_._2_1_,
                                                  CONCAT11(local_b0.data_._1_1_,local_b0.data_._0_1_
                                                          ))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = CBS_asn1_bitstring_has_bit(&cbs,0);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 == 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbs_2,(internal *)&gtest_ar_,
                 (AssertionResult *)"CBS_asn1_bitstring_has_bit(&cbs, 0)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_trace_1308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x500,(char *)cbs_2.data);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_trace_1308,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_trace_1308);
      std::__cxx11::string::~string((string *)&cbs_2);
      plVar1 = (long *)CONCAT44(local_b0.data_._4_4_,
                                CONCAT13(local_b0.data_._3_1_,
                                         CONCAT12(local_b0.data_._2_1_,
                                                  CONCAT11(local_b0.data_._1_1_,local_b0.data_._0_1_
                                                          ))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1256);
  }
  if ((anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::
                                 kBitTests);
    if (iVar2 != 0) {
      local_79 = '\0';
      __l_08._M_len = 1;
      __l_08._M_array = &local_79;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0].in,__l_08,&local_7a);
      TestBody::kBitTests[0].bit = 0;
      TestBody::kBitTests[0].bit_set = false;
      local_3e[0] = '\a';
      local_3e[1] = 0x80;
      __l_09._M_len = 2;
      __l_09._M_array = local_3e;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[1].in,__l_09,&local_7b);
      TestBody::kBitTests[1].bit = 0;
      TestBody::kBitTests[1].bit_set = true;
      cbs_2.data = (uint8_t *)CONCAT53(cbs_2.data._3_5_,0x400f06);
      __l_10._M_len = 3;
      __l_10._M_array = (iterator)&cbs_2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[2].in,__l_10,&local_7c);
      TestBody::kBitTests[2].bit = 0;
      TestBody::kBitTests[2].bit_set = false;
      cbs.data = (uint8_t *)CONCAT53(cbs.data._3_5_,0x400f06);
      __l_11._M_len = 3;
      __l_11._M_array = (iterator)&cbs;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[3].in,__l_11,&local_7d);
      TestBody::kBitTests[3].bit = 1;
      TestBody::kBitTests[3].bit_set = false;
      gtest_ar_.success_ = true;
      gtest_ar_._1_1_ = 0xf;
      gtest_ar_._2_1_ = 0x40;
      __l_12._M_len = 3;
      __l_12._M_array = &gtest_ar_.success_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[4].in,__l_12,&local_7e);
      TestBody::kBitTests[4].bit = 2;
      TestBody::kBitTests[4].bit_set = false;
      local_b0.data_._0_1_ = 6;
      local_b0.data_._1_1_ = 0xf;
      local_b0.data_._2_1_ = 0x40;
      __l_13._M_len = 3;
      __l_13._M_array = (iterator)&local_b0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[5].in,__l_13,&local_7f);
      TestBody::kBitTests[5].bit = 3;
      TestBody::kBitTests[5].bit_set = false;
      _gtest_trace_1308 = 0xf06;
      __l_14._M_len = 3;
      __l_14._M_array = (iterator)&gtest_trace_1308;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[6].in,__l_14,&local_80);
      TestBody::kBitTests[6].bit = 4;
      TestBody::kBitTests[6].bit_set = true;
      _gtest_trace_1256 = 0xf06;
      __l_15._M_len = 3;
      __l_15._M_array = (iterator)&gtest_trace_1256;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[7].in,__l_15,&local_81);
      TestBody::kBitTests[7].bit = 5;
      TestBody::kBitTests[7].bit_set = true;
      local_84 = 0xf06;
      local_82 = 0x40;
      __l_16._M_len = 3;
      __l_16._M_array = (iterator)&local_84;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[8].in,__l_16,&local_85);
      TestBody::kBitTests[8].bit = 6;
      TestBody::kBitTests[8].bit_set = true;
      local_88 = 0xf06;
      local_86 = 0x40;
      __l_17._M_len = 3;
      __l_17._M_array = (iterator)&local_88;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[9].in,__l_17,&local_89);
      TestBody::kBitTests[9].bit = 7;
      TestBody::kBitTests[9].bit_set = true;
      local_63 = 0xf06;
      local_61 = 0x40;
      __l_18._M_len = 3;
      __l_18._M_array = (iterator)&local_63;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[10].in,__l_18,&local_8a);
      TestBody::kBitTests[10].bit = 8;
      TestBody::kBitTests[10].bit_set = false;
      local_66 = 0xf06;
      local_64 = 0x40;
      __l_19._M_len = 3;
      __l_19._M_array = (iterator)&local_66;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xb].in,__l_19,&local_8b);
      TestBody::kBitTests[0xb].bit = 9;
      TestBody::kBitTests[0xb].bit_set = true;
      local_3e[0xb] = '\x06';
      local_3e[0xc] = '\x0f';
      local_3e[0xd] = 0x40;
      __l_20._M_len = 3;
      __l_20._M_array = local_3e + 0xb;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xc].in,__l_20,&local_8c);
      TestBody::kBitTests[0xc].bit = 10;
      TestBody::kBitTests[0xc].bit_set = false;
      local_3e[8] = '\x06';
      local_3e[9] = '\x0f';
      local_3e[10] = 0x40;
      __l_21._M_len = 3;
      __l_21._M_array = local_3e + 8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xd].in,__l_21,&local_8d);
      TestBody::kBitTests[0xd].bit = 0xf;
      TestBody::kBitTests[0xd].bit_set = false;
      local_3e[5] = '\x06';
      local_3e[6] = '\x0f';
      local_3e[7] = 0x40;
      __l_22._M_len = 3;
      __l_22._M_array = local_3e + 5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xe].in,__l_22,&local_8e);
      TestBody::kBitTests[0xe].bit = 0x10;
      TestBody::kBitTests[0xe].bit_set = false;
      local_3e[2] = '\x06';
      local_3e[3] = '\x0f';
      local_3e[4] = 0x40;
      __l_23._M_len = 3;
      __l_23._M_array = local_3e + 2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&TestBody::kBitTests[0xf].in,__l_23,&local_8f);
      TestBody::kBitTests[0xf].bit = 1000;
      TestBody::kBitTests[0xf].bit_set = false;
      __cxa_atexit(__cxx_global_array_dtor_403,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::CBSTest_BitString_Test::TestBody()::kBitTests);
    }
  }
  message = &TestBody::kBitTests[0].bit;
  for (lVar3 = 0x200; lVar3 != 0; lVar3 = lVar3 + -0x20) {
    cbs_2.data = (((anon_struct_32_3_50c92611 *)(message + -6))->in).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    cbs_2.len = (long)*(pointer *)(message + -4) - (long)cbs_2.data;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&gtest_trace_1308,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x51c,(Bytes *)&cbs_2);
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&gtest_trace_1256,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x51d,message);
    cbs_2.data = (((anon_struct_32_3_50c92611 *)(message + -6))->in).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    cbs_2.len = (long)*(pointer *)(message + -4) - (long)cbs_2.data;
    gtest_ar_.success_ = *(bool *)(message + 1);
    gtest_ar_._1_1_ = 0;
    gtest_ar_._2_1_ = 0;
    gtest_ar_._3_1_ = 0;
    iVar2 = CBS_asn1_bitstring_has_bit(&cbs_2,*message);
    local_b0.data_._0_1_ = (undefined1)iVar2;
    local_b0.data_._1_1_ = (undefined1)((uint)iVar2 >> 8);
    local_b0.data_._2_1_ = (undefined1)((uint)iVar2 >> 0x10);
    local_b0.data_._3_1_ = (undefined1)((uint)iVar2 >> 0x18);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&cbs,"static_cast<int>(test.bit_set)",
               "CBS_asn1_bitstring_has_bit(&cbs, test.bit)",(int *)&gtest_ar_,(int *)&local_b0);
    if ((char)cbs.data == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      message_00 = "";
      if (cbs.len != 0) {
        message_00 = *(char **)cbs.len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x521,message_00);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      plVar1 = (long *)CONCAT44(gtest_ar_._4_4_,
                                CONCAT13(gtest_ar_._3_1_,
                                         CONCAT12(gtest_ar_._2_1_,
                                                  CONCAT11(gtest_ar_._1_1_,gtest_ar_.success_))));
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cbs.len);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1256);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1308);
    message = message + 8;
  }
  return;
}

Assistant:

TEST(CBSTest, BitString) {
  static const std::vector<uint8_t> kValidBitStrings[] = {
      {0x00},                                      // 0 bits
      {0x07, 0x80},                                // 1 bit
      {0x04, 0xf0},                                // 4 bits
      {0x00, 0xff},                                // 8 bits
      {0x06, 0xff, 0xff, 0xff, 0xff, 0xff, 0xc0},  // 42 bits
  };
  for (const auto &test : kValidBitStrings) {
    SCOPED_TRACE(Bytes(test.data(), test.size()));
    CBS cbs;
    CBS_init(&cbs, test.data(), test.size());
    EXPECT_TRUE(CBS_is_valid_asn1_bitstring(&cbs));
  }

  static const std::vector<uint8_t> kInvalidBitStrings[] = {
      // BIT STRINGs always have a leading byte.
      std::vector<uint8_t>{},
      // It's not possible to take an unused bit off the empty string.
      {0x01},
      // There can be at most 7 unused bits.
      {0x08, 0xff},
      {0xff, 0xff},
      // All unused bits must be cleared.
      {0x06, 0xff, 0xc1},
  };
  for (const auto &test : kInvalidBitStrings) {
    SCOPED_TRACE(Bytes(test.data(), test.size()));
    CBS cbs;
    CBS_init(&cbs, test.data(), test.size());
    EXPECT_FALSE(CBS_is_valid_asn1_bitstring(&cbs));

    // CBS_asn1_bitstring_has_bit returns false on invalid inputs.
    EXPECT_FALSE(CBS_asn1_bitstring_has_bit(&cbs, 0));
  }

  static const struct {
    std::vector<uint8_t> in;
    unsigned bit;
    bool bit_set;
  } kBitTests[] = {
      // Basic tests.
      {{0x00}, 0, false},
      {{0x07, 0x80}, 0, true},
      {{0x06, 0x0f, 0x40}, 0, false},
      {{0x06, 0x0f, 0x40}, 1, false},
      {{0x06, 0x0f, 0x40}, 2, false},
      {{0x06, 0x0f, 0x40}, 3, false},
      {{0x06, 0x0f, 0x40}, 4, true},
      {{0x06, 0x0f, 0x40}, 5, true},
      {{0x06, 0x0f, 0x40}, 6, true},
      {{0x06, 0x0f, 0x40}, 7, true},
      {{0x06, 0x0f, 0x40}, 8, false},
      {{0x06, 0x0f, 0x40}, 9, true},
      // Out-of-bounds bits return 0.
      {{0x06, 0x0f, 0x40}, 10, false},
      {{0x06, 0x0f, 0x40}, 15, false},
      {{0x06, 0x0f, 0x40}, 16, false},
      {{0x06, 0x0f, 0x40}, 1000, false},
  };
  for (const auto &test : kBitTests) {
    SCOPED_TRACE(Bytes(test.in.data(), test.in.size()));
    SCOPED_TRACE(test.bit);
    CBS cbs;
    CBS_init(&cbs, test.in.data(), test.in.size());
    EXPECT_EQ(static_cast<int>(test.bit_set),
              CBS_asn1_bitstring_has_bit(&cbs, test.bit));
  }
}